

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_util.cpp
# Opt level: O0

string * cali::util::clamp_string(string *__return_storage_ptr__,string *str,size_t max_width)

{
  ulong uVar1;
  long lVar2;
  size_t max_width_local;
  string *str_local;
  string *ret;
  
  uVar1 = std::__cxx11::string::length();
  if (max_width < uVar1) {
    if (max_width < 4) {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str);
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
      std::__cxx11::string::append((string *)__return_storage_ptr__,(ulong)str,0);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      lVar2 = std::__cxx11::string::length();
      std::__cxx11::string::append
                ((string *)__return_storage_ptr__,(ulong)str,(lVar2 + 1) - (max_width >> 1));
    }
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cali::util::clamp_string(const std::string& str, std::size_t max_width)
{
    if (str.length() <= max_width)
        return str;
    if (max_width < 4)
        return str.substr(0, max_width);

    std::string ret;
    ret.reserve(1 + max_width);

    ret.append(str, 0, max_width / 2 - 1);
    ret.append("~~");
    ret.append(str, str.length() - (max_width / 2 - 1), std::string::npos);

    return ret;
}